

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

string * __thiscall
CBlockIndex::ToString_abi_cxx11_(string *__return_storage_ptr__,CBlockIndex *this)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  base_blob<256u> local_80 [32];
  string local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256u>::ToString_abi_cxx11_(&local_40,(base_blob<256u> *)&this->hashMerkleRoot);
  GetBlockHash((uint256 *)local_80,this);
  base_blob<256u>::ToString_abi_cxx11_(&local_60,local_80);
  tinyformat::format<CBlockIndex*,int,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,
             (tinyformat *)"CBlockIndex(pprev=%p, nHeight=%d, merkle=%s, hashBlock=%s)",
             (char *)&this->pprev,(CBlockIndex **)&this->nHeight,(int *)&local_40,&local_60,
             in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CBlockIndex::ToString() const
{
    return strprintf("CBlockIndex(pprev=%p, nHeight=%d, merkle=%s, hashBlock=%s)",
                     pprev, nHeight, hashMerkleRoot.ToString(), GetBlockHash().ToString());
}